

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.h
# Opt level: O2

void __thiscall
cmComputeLinkDepends::LinkEntry::LinkEntry
          (LinkEntry *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item
          ,cmGeneratorTarget *target)

{
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&this->Item,item);
  this->Target = target;
  this->Kind = Library;
  std::__cxx11::string::string((string *)&this->Feature,(string *)&DEFAULT_abi_cxx11_);
  return;
}

Assistant:

LinkEntry(BT<std::string> item, cmGeneratorTarget const* target = nullptr)
      : Item(std::move(item))
      , Target(target)
    {
    }